

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O1

void quantize_fs_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,
                       int num_rows)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  JSAMPLE *pJVar5;
  jpeg_color_quantizer *pjVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  byte *pbVar10;
  _func_void_j_decompress_ptr *p_Var11;
  uint uVar12;
  int iVar14;
  ulong uVar15;
  JSAMPROW pJVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar13;
  
  if (0 < num_rows) {
    uVar3 = cinfo->output_width;
    uVar4 = cinfo->out_color_components;
    pJVar5 = cinfo->sample_range_limit;
    pjVar6 = cinfo->cquantize;
    uVar15 = 0;
    do {
      memset(output_buf[uVar15],0,(ulong)uVar3);
      if (0 < (int)uVar4) {
        uVar9 = 0;
        do {
          pbVar10 = input_buf[uVar15] + uVar9;
          pJVar16 = output_buf[uVar15];
          if (*(int *)&pjVar6[4].finish_pass == 0) {
            p_Var11 = (&pjVar6[3].finish_pass)[uVar9];
            lVar17 = 1;
            uVar18 = uVar4;
          }
          else {
            pbVar10 = pbVar10 + (uVar3 - 1) * uVar4;
            pJVar16 = pJVar16 + (uVar3 - 1);
            p_Var11 = (&pjVar6[3].finish_pass)[uVar9] + (ulong)(uVar3 + 1) * 2;
            lVar17 = -1;
            uVar18 = -uVar4;
          }
          iVar21 = 0;
          iVar19 = iVar21;
          if (uVar3 != 0) {
            lVar7 = *(long *)(pjVar6[1].finish_pass + uVar9 * 8);
            lVar8 = *(long *)(pjVar6[1].start_pass + uVar9 * 8);
            iVar19 = 0;
            uVar13 = (ulong)uVar3;
            iVar20 = 0;
            do {
              bVar1 = pJVar5[(long)(*(short *)(p_Var11 + lVar17 * 2) + iVar21 + 8 >> 4) +
                             (ulong)*pbVar10];
              bVar2 = *(byte *)(lVar7 + (ulong)bVar1);
              *pJVar16 = *pJVar16 + bVar2;
              iVar14 = (uint)bVar1 - (uint)*(byte *)(lVar8 + (ulong)bVar2);
              *(short *)p_Var11 = (short)iVar14 * 3 + (short)iVar19;
              iVar19 = iVar14 * 5 + iVar20;
              iVar21 = iVar14 * 7;
              pbVar10 = pbVar10 + (int)uVar18;
              pJVar16 = pJVar16 + lVar17;
              p_Var11 = p_Var11 + lVar17 * 2;
              uVar12 = (int)uVar13 - 1;
              uVar13 = (ulong)uVar12;
              iVar20 = iVar14;
            } while (uVar12 != 0);
          }
          *(short *)p_Var11 = (short)iVar19;
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar4);
      }
      *(uint *)&pjVar6[4].finish_pass = (uint)(*(int *)&pjVar6[4].finish_pass == 0);
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uint)num_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
quantize_fs_dither (j_decompress_ptr cinfo, JSAMPARRAY input_buf,
		    JSAMPARRAY output_buf, int num_rows)
/* General case, with Floyd-Steinberg dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  register LOCFSERROR cur;	/* current error or pixel value */
  LOCFSERROR belowerr;		/* error for pixel below cur */
  LOCFSERROR bpreverr;		/* error for below/prev col */
  LOCFSERROR bnexterr;		/* error for below/next col */
  LOCFSERROR delta;
  register FSERRPTR errorptr;	/* => fserrors[] at column before current */
  register JSAMPROW input_ptr;
  register JSAMPROW output_ptr;
  JSAMPROW colorindex_ci;
  JSAMPROW colormap_ci;
  int pixcode;
  int nc = cinfo->out_color_components;
  int dir;			/* 1 for left-to-right, -1 for right-to-left */
  int dirnc;			/* dir * nc */
  int ci;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;
  JSAMPLE *range_limit = cinfo->sample_range_limit;
  SHIFT_TEMPS

  for (row = 0; row < num_rows; row++) {
    /* Initialize output values to 0 so can process components separately */
    FMEMZERO((void FAR *) output_buf[row],
	     (size_t) (width * SIZEOF(JSAMPLE)));
    for (ci = 0; ci < nc; ci++) {
      input_ptr = input_buf[row] + ci;
      output_ptr = output_buf[row];
      if (cquantize->on_odd_row) {
	/* work right to left in this row */
	input_ptr += (width-1) * nc; /* so point to rightmost pixel */
	output_ptr += width-1;
	dir = -1;
	dirnc = -nc;
	errorptr = cquantize->fserrors[ci] + (width+1); /* => entry after last column */
      } else {
	/* work left to right in this row */
	dir = 1;
	dirnc = nc;
	errorptr = cquantize->fserrors[ci]; /* => entry before first column */
      }
      colorindex_ci = cquantize->colorindex[ci];
      colormap_ci = cquantize->sv_colormap[ci];
      /* Preset error values: no error propagated to first pixel from left */
      cur = 0;
      /* and no error propagated to row below yet */
      belowerr = bpreverr = 0;

      for (col = width; col > 0; col--) {
	/* cur holds the error propagated from the previous pixel on the
	 * current line.  Add the error propagated from the previous line
	 * to form the complete error correction term for this pixel, and
	 * round the error term (which is expressed * 16) to an integer.
	 * RIGHT_SHIFT rounds towards minus infinity, so adding 8 is correct
	 * for either sign of the error value.
	 * Note: errorptr points to *previous* column's array entry.
	 */
	cur = RIGHT_SHIFT(cur + errorptr[dir] + 8, 4);
	/* Form pixel value + error, and range-limit to 0..MAXJSAMPLE.
	 * The maximum error is +- MAXJSAMPLE; this sets the required size
	 * of the range_limit array.
	 */
	cur += GETJSAMPLE(*input_ptr);
	cur = GETJSAMPLE(range_limit[cur]);
	/* Select output value, accumulate into output code for this pixel */
	pixcode = GETJSAMPLE(colorindex_ci[cur]);
	*output_ptr += (JSAMPLE) pixcode;
	/* Compute actual representation error at this pixel */
	/* Note: we can do this even though we don't have the final */
	/* pixel code, because the colormap is orthogonal. */
	cur -= GETJSAMPLE(colormap_ci[pixcode]);
	/* Compute error fractions to be propagated to adjacent pixels.
	 * Add these into the running sums, and simultaneously shift the
	 * next-line error sums left by 1 column.
	 */
	bnexterr = cur;
	delta = cur * 2;
	cur += delta;		/* form error * 3 */
	errorptr[0] = (FSERROR) (bpreverr + cur);
	cur += delta;		/* form error * 5 */
	bpreverr = belowerr + cur;
	belowerr = bnexterr;
	cur += delta;		/* form error * 7 */
	/* At this point cur contains the 7/16 error value to be propagated
	 * to the next pixel on the current line, and all the errors for the
	 * next line have been shifted over. We are therefore ready to move on.
	 */
	input_ptr += dirnc;	/* advance input ptr to next column */
	output_ptr += dir;	/* advance output ptr to next column */
	errorptr += dir;	/* advance errorptr to current column */
      }
      /* Post-loop cleanup: we must unload the final error value into the
       * final fserrors[] entry.  Note we need not unload belowerr because
       * it is for the dummy column before or after the actual array.
       */
      errorptr[0] = (FSERROR) bpreverr; /* unload prev err into array */
    }
    cquantize->on_odd_row = (cquantize->on_odd_row ? FALSE : TRUE);
  }
}